

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathCalculator.cpp
# Opt level: O0

void __thiscall
tiger::trains::ai::PathCalculator::calculate(PathCalculator *this,LineBlocker *blocker)

{
  int iVar1;
  LineBlock lineBlock;
  Point *pPVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  pointer ppVar6;
  reference ppLVar7;
  mapped_type *pmVar8;
  value_type *__x;
  pair<std::_Rb_tree_const_iterator<std::pair<int,_const_tiger::trains::world::Point_*>_>,_bool>
  pVar9;
  Point *another;
  Line *line;
  const_iterator __end2;
  const_iterator __begin2;
  vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_> *__range2;
  Point *minPoint;
  set<std::pair<int,_const_tiger::trains::world::Point_*>,_std::less<std::pair<int,_const_tiger::trains::world::Point_*>_>,_std::allocator<std::pair<int,_const_tiger::trains::world::Point_*>_>_>
  setMinLen;
  undefined7 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7f;
  _Rb_tree_const_iterator<std::pair<int,_const_tiger::trains::world::Point_*>_>
  in_stack_fffffffffffffe80;
  const_iterator in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  LineBlocker *in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  mapped_type mVar10;
  undefined4 in_stack_fffffffffffffeb4;
  key_type *in_stack_fffffffffffffeb8;
  map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
  *in_stack_fffffffffffffec0;
  pair<int,_const_tiger::trains::world::Point_*> local_c8;
  pair<int,_const_tiger::trains::world::Point_*> local_b8;
  Point *local_a8;
  LineBlock local_a0;
  Line *local_90;
  Line **local_88;
  __normal_iterator<tiger::trains::world::Line_*const_*,_std::vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>_>
  local_80;
  vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_> *local_78;
  _Base_ptr local_70;
  _Base_ptr local_68;
  _Base_ptr local_60;
  Point *local_58;
  
  std::
  set<std::pair<int,_const_tiger::trains::world::Point_*>,_std::less<std::pair<int,_const_tiger::trains::world::Point_*>_>,_std::allocator<std::pair<int,_const_tiger::trains::world::Point_*>_>_>
  ::set((set<std::pair<int,_const_tiger::trains::world::Point_*>,_std::less<std::pair<int,_const_tiger::trains::world::Point_*>_>,_std::allocator<std::pair<int,_const_tiger::trains::world::Point_*>_>_>
         *)0x25e11c);
  startInit((PathCalculator *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
            in_stack_fffffffffffffea8,
            (set<std::pair<int,_const_tiger::trains::world::Point_*>,_std::less<std::pair<int,_const_tiger::trains::world::Point_*>_>,_std::allocator<std::pair<int,_const_tiger::trains::world::Point_*>_>_>
             *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
  while (bVar3 = std::
                 set<std::pair<int,_const_tiger::trains::world::Point_*>,_std::less<std::pair<int,_const_tiger::trains::world::Point_*>_>,_std::allocator<std::pair<int,_const_tiger::trains::world::Point_*>_>_>
                 ::empty((set<std::pair<int,_const_tiger::trains::world::Point_*>,_std::less<std::pair<int,_const_tiger::trains::world::Point_*>_>,_std::allocator<std::pair<int,_const_tiger::trains::world::Point_*>_>_>
                          *)0x25e14a), ((bVar3 ^ 0xffU) & 1) != 0) {
    local_60 = (_Base_ptr)
               std::
               set<std::pair<int,_const_tiger::trains::world::Point_*>,_std::less<std::pair<int,_const_tiger::trains::world::Point_*>_>,_std::allocator<std::pair<int,_const_tiger::trains::world::Point_*>_>_>
               ::begin((set<std::pair<int,_const_tiger::trains::world::Point_*>,_std::less<std::pair<int,_const_tiger::trains::world::Point_*>_>,_std::allocator<std::pair<int,_const_tiger::trains::world::Point_*>_>_>
                        *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
    ppVar6 = std::_Rb_tree_const_iterator<std::pair<int,_const_tiger::trains::world::Point_*>_>::
             operator->((_Rb_tree_const_iterator<std::pair<int,_const_tiger::trains::world::Point_*>_>
                         *)in_stack_fffffffffffffe80._M_node);
    local_58 = ppVar6->second;
    local_68 = (_Base_ptr)
               std::
               set<std::pair<int,_const_tiger::trains::world::Point_*>,_std::less<std::pair<int,_const_tiger::trains::world::Point_*>_>,_std::allocator<std::pair<int,_const_tiger::trains::world::Point_*>_>_>
               ::begin((set<std::pair<int,_const_tiger::trains::world::Point_*>,_std::less<std::pair<int,_const_tiger::trains::world::Point_*>_>,_std::allocator<std::pair<int,_const_tiger::trains::world::Point_*>_>_>
                        *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
    local_70 = (_Base_ptr)
               std::
               set<std::pair<int,tiger::trains::world::Point_const*>,std::less<std::pair<int,tiger::trains::world::Point_const*>>,std::allocator<std::pair<int,tiger::trains::world::Point_const*>>>
               ::erase_abi_cxx11_(in_stack_fffffffffffffe80._M_node,in_stack_fffffffffffffe88);
    local_78 = trains::world::Point::getEdges((Point *)0x25e1dc);
    local_80._M_current =
         (Line **)std::
                  vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
                  ::begin((vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
                           *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
    local_88 = (Line **)std::
                        vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
                        ::end((vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
                               *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
    while (bVar3 = __gnu_cxx::operator!=
                             ((__normal_iterator<tiger::trains::world::Line_*const_*,_std::vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>_>
                               *)in_stack_fffffffffffffe80._M_node,
                              (__normal_iterator<tiger::trains::world::Line_*const_*,_std::vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>_>
                               *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78)),
          bVar3) {
      ppLVar7 = __gnu_cxx::
                __normal_iterator<tiger::trains::world::Line_*const_*,_std::vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>_>
                ::operator*(&local_80);
      local_90 = *ppLVar7;
      LineBlock::LineBlock(&local_a0,local_90,local_58);
      lineBlock.line._7_1_ = in_stack_fffffffffffffe7f;
      lineBlock.line._0_7_ = in_stack_fffffffffffffe78;
      lineBlock.inPoint = (Point *)in_stack_fffffffffffffe80._M_node;
      bVar3 = LineBlocker::contain((LineBlocker *)0x25e2a2,lineBlock);
      if ((!bVar3) &&
         (bVar3 = BotSharedData::canMove
                            ((BotSharedData *)in_stack_fffffffffffffe88._M_node,
                             (Point *)in_stack_fffffffffffffe80._M_node,
                             (Line *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78)),
         bVar3)) {
        local_a8 = trains::world::Line::getAnotherPoint(local_90,local_58);
        pmVar8 = std::
                 map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
                 ::operator[](in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
        iVar5 = *pmVar8;
        pmVar8 = std::
                 map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
                 ::operator[](in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
        iVar1 = *pmVar8;
        iVar4 = trains::world::Line::getLenght(local_90);
        if (iVar1 + iVar4 < iVar5) {
          in_stack_fffffffffffffec0 =
               (map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
                *)std::
                  map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
                  ::operator[](in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
          std::pair<int,_const_tiger::trains::world::Point_*>::
          pair<int_&,_const_tiger::trains::world::Point_*&,_true>
                    (&local_b8,(int *)in_stack_fffffffffffffec0,&local_a8);
          std::
          set<std::pair<int,_const_tiger::trains::world::Point_*>,_std::less<std::pair<int,_const_tiger::trains::world::Point_*>_>,_std::allocator<std::pair<int,_const_tiger::trains::world::Point_*>_>_>
          ::erase((set<std::pair<int,_const_tiger::trains::world::Point_*>,_std::less<std::pair<int,_const_tiger::trains::world::Point_*>_>,_std::allocator<std::pair<int,_const_tiger::trains::world::Point_*>_>_>
                   *)in_stack_fffffffffffffe80._M_node,
                  (key_type *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
          in_stack_fffffffffffffeb8 =
               (key_type *)
               std::
               map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
               ::operator[](in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
          mVar10 = *(mapped_type *)in_stack_fffffffffffffeb8;
          iVar5 = trains::world::Line::getLenght(local_90);
          iVar5 = mVar10 + iVar5;
          pmVar8 = std::
                   map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
                   ::operator[](in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
          pPVar2 = local_58;
          *pmVar8 = iVar5;
          __x = (value_type *)
                std::
                map<const_tiger::trains::world::Point_*,_const_tiger::trains::world::Point_*,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_const_tiger::trains::world::Point_*>_>_>
                ::operator[]((map<const_tiger::trains::world::Point_*,_const_tiger::trains::world::Point_*,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_const_tiger::trains::world::Point_*>_>_>
                              *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
          *(Point **)__x = pPVar2;
          in_stack_fffffffffffffe88._M_node =
               (_Base_ptr)
               std::
               map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
               ::operator[](in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
          std::pair<int,_const_tiger::trains::world::Point_*>::
          pair<int_&,_const_tiger::trains::world::Point_*&,_true>
                    (&local_c8,(int *)in_stack_fffffffffffffe88._M_node,&local_a8);
          pVar9 = std::
                  set<std::pair<int,_const_tiger::trains::world::Point_*>,_std::less<std::pair<int,_const_tiger::trains::world::Point_*>_>,_std::allocator<std::pair<int,_const_tiger::trains::world::Point_*>_>_>
                  ::insert((set<std::pair<int,_const_tiger::trains::world::Point_*>,_std::less<std::pair<int,_const_tiger::trains::world::Point_*>_>,_std::allocator<std::pair<int,_const_tiger::trains::world::Point_*>_>_>
                            *)CONCAT44(iVar5,in_stack_fffffffffffffea0),__x);
          in_stack_fffffffffffffe80 = pVar9.first._M_node;
          in_stack_fffffffffffffe7f = pVar9.second;
        }
      }
      __gnu_cxx::
      __normal_iterator<tiger::trains::world::Line_*const_*,_std::vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>_>
      ::operator++(&local_80);
    }
  }
  std::
  set<std::pair<int,_const_tiger::trains::world::Point_*>,_std::less<std::pair<int,_const_tiger::trains::world::Point_*>_>,_std::allocator<std::pair<int,_const_tiger::trains::world::Point_*>_>_>
  ::~set((set<std::pair<int,_const_tiger::trains::world::Point_*>,_std::less<std::pair<int,_const_tiger::trains::world::Point_*>_>,_std::allocator<std::pair<int,_const_tiger::trains::world::Point_*>_>_>
          *)0x25e554);
  return;
}

Assistant:

void PathCalculator::calculate(LineBlocker &blocker)
{

    std::set< std::pair<int, const world::Point *>> setMinLen;

    startInit(blocker, setMinLen);

    while (!setMinLen.empty())
    {
        auto minPoint = setMinLen.begin()->second;
        setMinLen.erase(setMinLen.begin());

        for (auto line : minPoint->getEdges())
        {
            if (blocker.contain({line, minPoint}) || !sharedData->canMove(minPoint, line))
                continue;

            const world::Point *another = line->getAnotherPoint(minPoint);

            if (minLen[another] > minLen[minPoint] + line->getLenght())
            {
                setMinLen.erase({minLen[another], another});
                minLen[another] = minLen[minPoint] + line->getLenght();
                ancestors[another] = minPoint;
                setMinLen.insert({minLen[another], another});
            }
        }

    }

}